

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O1

void show_string(descriptor_data *d,char *input)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  int iVar6;
  char *pcVar7;
  char buf [4608];
  char buffer [18432];
  char local_5a28 [4608];
  char local_4828 [18440];
  
  one_argument(input,local_5a28);
  if (local_5a28[0] == '\0') {
    iVar3 = 0;
    iVar4 = 0;
    if (d->character != (CHAR_DATA *)0x0) {
      iVar4 = d->character->lines;
    }
    iVar6 = 1;
    pcVar7 = local_4828;
    pcVar2 = d->showstr_point;
    do {
      cVar1 = *pcVar2;
      *pcVar7 = cVar1;
      if ((cVar1 == '\r') || (cVar1 == '\n')) {
        if (iVar6 < 1) {
          iVar6 = -iVar6;
          goto LAB_0027a2e5;
        }
        iVar3 = iVar3 + 1;
        iVar6 = -1;
      }
      else {
LAB_0027a2e5:
        if ((cVar1 == '\0') || (0 < iVar4 && iVar4 <= iVar3)) goto LAB_0027a30f;
      }
      pcVar7 = pcVar7 + 1;
      d->showstr_point = pcVar2 + 1;
      pcVar2 = pcVar2 + 1;
    } while( true );
  }
  if (d->showstr_head != (char *)0x0) {
    operator_delete__(d->showstr_head);
    d->showstr_head = (char *)0x0;
  }
LAB_0027a28b:
  d->showstr_point = (char *)0x0;
  return;
LAB_0027a30f:
  *pcVar7 = '\0';
  sVar5 = strlen(local_4828);
  write_to_buffer(d,local_4828,(int)sVar5);
  pcVar7 = d->showstr_point;
  do {
    cVar1 = *pcVar7;
    iVar4 = isspace((int)cVar1);
    pcVar7 = pcVar7 + 1;
  } while (iVar4 != 0);
  if (cVar1 != '\0') {
    return;
  }
  if (d->showstr_head != (char *)0x0) {
    operator_delete__(d->showstr_head);
    d->showstr_head = (char *)0x0;
  }
  goto LAB_0027a28b;
}

Assistant:

void show_string(struct descriptor_data *d, char *input)
{
	char buffer[4 * MAX_STRING_LENGTH];
	char buf[MAX_INPUT_LENGTH];
	char *scan, *chk;
	int lines = 0, toggle = 1;
	int show_lines;

	one_argument(input, buf);
	if (buf[0] != '\0')
	{
		if (d->showstr_head)
		{
			delete[] d->showstr_head;
			d->showstr_head = 0;
		}

		d->showstr_point = 0;
		return;
	}

	if (d->character)
		show_lines = d->character->lines;
	else
		show_lines = 0;

	for (scan = buffer;; scan++, d->showstr_point++)
	{
		if (((*scan = *d->showstr_point) == '\n' || *scan == '\r') && (toggle = -toggle) < 0)
		{
			lines++;
		}
		else if (!*scan || (show_lines > 0 && lines >= show_lines))
		{
			*scan = '\0';
			write_to_buffer(d, buffer, strlen(buffer));
			for (chk = d->showstr_point; isspace(*chk); chk++);
			{
				if (!*chk)
				{
					if (d->showstr_head)
					{
						delete[] d->showstr_head;
						d->showstr_head = 0;
					}
					d->showstr_point = 0;
				}
			}

			return;
		}
	}
}